

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

void __thiscall
cmCTestBuildHandler::GenerateXMLFooter
          (cmCTestBuildHandler *this,cmXMLWriter *xml,double elapsed_build_time)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  string local_50;
  double local_30;
  undefined1 local_28 [16];
  
  local_28._8_4_ = in_XMM0_Dc;
  local_28._0_8_ = elapsed_build_time;
  local_28._12_4_ = in_XMM0_Dd;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Log","");
  cmXMLWriter::StartElement(xml,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[7]>(xml,"Encoding",(char (*) [7])"base64");
  cmXMLWriter::Attribute<char[9]>(xml,"Compression",(char (*) [9])"bin/gzip");
  cmXMLWriter::EndElement(xml);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"EndDateTime","");
  cmXMLWriter::StartElement(xml,&local_50);
  cmXMLWriter::Content<std::__cxx11::string>(xml,&this->EndBuild);
  cmXMLWriter::EndElement(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"EndBuildTime","");
  local_30 = (double)CONCAT44(local_30._4_4_,(int)(long)this->EndBuildTime);
  cmXMLWriter::Element<unsigned_int>(xml,&local_50,(uint *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ElapsedMinutes","");
  local_30 = (double)(int)((double)local_28._0_8_ / 6.0) / 10.0;
  cmXMLWriter::Element<double>(xml,&local_50,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(xml);
  cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,xml);
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLFooter(cmXMLWriter& xml,
                                            double elapsed_build_time)
{
  xml.StartElement("Log");
  xml.Attribute("Encoding", "base64");
  xml.Attribute("Compression", "bin/gzip");
  xml.EndElement(); // Log

  xml.Element("EndDateTime", this->EndBuild);
  xml.Element("EndBuildTime", static_cast<unsigned int>(this->EndBuildTime));
  xml.Element("ElapsedMinutes", static_cast<int>(elapsed_build_time/6)/10.0);
  xml.EndElement(); // Build
  this->CTest->EndXML(xml);
}